

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

MESSAGE_BODY_TYPE internal_get_body_type(MESSAGE_HANDLE message)

{
  MESSAGE_BODY_TYPE MVar1;
  
  MVar1 = MESSAGE_BODY_TYPE_VALUE;
  if ((message->body_amqp_value == (AMQP_VALUE)0x0) &&
     (MVar1 = MESSAGE_BODY_TYPE_DATA, message->body_amqp_data_count == 0)) {
    return (uint)(message->body_amqp_sequence_count != 0) * 2 + MESSAGE_BODY_TYPE_NONE;
  }
  return MVar1;
}

Assistant:

MESSAGE_BODY_TYPE internal_get_body_type(MESSAGE_HANDLE message)
{
    MESSAGE_BODY_TYPE result;

    if (message->body_amqp_value != NULL)
    {
        result = MESSAGE_BODY_TYPE_VALUE;
    }
    else if (message->body_amqp_data_count > 0)
    {
        result = MESSAGE_BODY_TYPE_DATA;
    }
    else if (message->body_amqp_sequence_count > 0)
    {
        result = MESSAGE_BODY_TYPE_SEQUENCE;
    }
    else
    {
        result = MESSAGE_BODY_TYPE_NONE;
    }

    return result;
}